

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picker.cpp
# Opt level: O1

void __thiscall
QtMWidgets::PickerPrivate::makeNextIndex(PickerPrivate *this,QPersistentModelIndex *index)

{
  PickerPrivate *pPVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  QAbstractItemModel *pQVar5;
  QModelIndex local_60;
  QModelIndex local_48;
  
  iVar2 = QPersistentModelIndex::row();
  pPVar1 = (this->q->d).d;
  pQVar5 = pPVar1->model;
  QPersistentModelIndex::operator_cast_to_QModelIndex(&local_60,&pPVar1->root);
  iVar3 = (**(code **)(*(long *)pQVar5 + 0x78))(pQVar5,&local_60);
  if (iVar2 == iVar3 + -1) {
    pQVar5 = this->model;
    iVar2 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->root);
    lVar4 = *(long *)pQVar5;
    iVar3 = 0;
  }
  else {
    pQVar5 = this->model;
    iVar3 = QPersistentModelIndex::row();
    iVar3 = iVar3 + 1;
    iVar2 = this->modelColumn;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_48,&this->root);
    lVar4 = *(long *)pQVar5;
  }
  (**(code **)(lVar4 + 0x60))(&local_60,pQVar5,iVar3,iVar2,&local_48);
  QPersistentModelIndex::operator=(index,&local_60);
  return;
}

Assistant:

void
PickerPrivate::makeNextIndex( QPersistentModelIndex & index )
{
	if( index.row() == q->count() - 1 )
		index = model->index( 0, modelColumn, root );
	else
		index = model->index( index.row() + 1, modelColumn, root );
}